

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

void Js::JavascriptArray::CopyArrayElements
               (JavascriptArray *dstArray,uint32 dstIndex,JavascriptArray *srcArray,uint32 start,
               uint32 end)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  uVar1 = (srcArray->super_ArrayObject).length;
  if (uVar1 < end) {
    end = uVar1;
  }
  if (start < end) {
    if (CARRY4(end - start,dstIndex)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x2ca6,"(end - start <= MaxArrayLength - dstIndex)",
                                  "end - start <= MaxArrayLength - dstIndex");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    InternalCopyArrayElements(dstArray,dstIndex,srcArray,start,end);
    return;
  }
  return;
}

Assistant:

void JavascriptArray::CopyArrayElements(JavascriptArray* dstArray, uint32 dstIndex, JavascriptArray* srcArray, uint32 start, uint32 end)
    {
        end = min(end, srcArray->length);
        if (start < end)
        {
            Assert(end - start <= MaxArrayLength - dstIndex);
            InternalCopyArrayElements(dstArray, dstIndex, srcArray, start, end);
        }
    }